

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_scan_sse2_128_16.c
# Opt level: O2

parasail_result_t *
parasail_nw_stats_rowcol_scan_profile_sse2_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  ushort *puVar1;
  short *psVar2;
  void *pvVar3;
  parasail_matrix_t *ppVar4;
  void *pvVar5;
  void *pvVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int iVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  parasail_result_t *ppVar15;
  __m128i *b;
  __m128i *b_00;
  __m128i *b_01;
  __m128i *b_02;
  __m128i *ptr;
  __m128i *b_03;
  __m128i *b_04;
  __m128i *b_05;
  __m128i *ptr_00;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  __m128i *ptr_04;
  __m128i *ptr_05;
  int16_t *ptr_06;
  uint uVar16;
  size_t len;
  ulong uVar17;
  __m128i *palVar18;
  long lVar19;
  __m128i *palVar20;
  char *pcVar21;
  uint uVar22;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  uint uVar23;
  int16_t iVar24;
  int iVar25;
  int iVar26;
  char *__format;
  undefined4 uVar27;
  long lVar28;
  undefined2 uVar29;
  int iVar30;
  long lVar31;
  ulong uVar32;
  bool bVar33;
  undefined4 uVar35;
  uint uVar36;
  ulong uVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  __m128i alVar44;
  __m128i alVar45;
  ulong uVar53;
  __m128i alVar54;
  undefined1 auVar55 [16];
  __m128i alVar56;
  ulong uVar58;
  __m128i alVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  __m128i alVar64;
  __m128i alVar65;
  ushort uVar73;
  ulong uVar74;
  ushort uVar82;
  ushort uVar83;
  ushort uVar85;
  ushort uVar87;
  ushort uVar88;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  ushort uVar84;
  ushort uVar89;
  undefined1 auVar79 [16];
  long lVar86;
  __m128i alVar80;
  __m128i alVar81;
  ulong uVar90;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  long lVar95;
  __m128i alVar93;
  undefined1 auVar94 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  ushort uVar116;
  ushort uVar119;
  ushort uVar120;
  ushort uVar121;
  ushort uVar122;
  ushort uVar123;
  ushort uVar124;
  undefined1 auVar117 [16];
  ushort uVar125;
  undefined1 auVar118 [16];
  short sVar126;
  ushort uVar127;
  ushort uVar128;
  short sVar130;
  ushort uVar131;
  ushort uVar132;
  short sVar133;
  ushort uVar134;
  ushort uVar135;
  short sVar136;
  ushort uVar137;
  ushort uVar138;
  short sVar139;
  ushort uVar140;
  ushort uVar141;
  short sVar142;
  ushort uVar143;
  ushort uVar144;
  short sVar145;
  ushort uVar146;
  ushort uVar147;
  undefined1 auVar129 [16];
  short sVar148;
  ushort uVar149;
  ushort uVar150;
  __m128i alVar151;
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  __m128i c_02;
  __m128i c_03;
  __m128i vH;
  __m128i vH_00;
  __m128i vH_01;
  __m128i vH_02;
  undefined1 local_1e8 [16];
  undefined1 local_1c8 [16];
  ushort local_128;
  ushort uStack_126;
  int local_118;
  undefined4 uStack_114;
  uint uStack_110;
  undefined4 uStack_10c;
  ushort local_88;
  ushort uStack_86;
  __m128i_16_t h;
  short sVar34;
  short sVar46;
  short sVar47;
  short sVar48;
  short sVar49;
  short sVar50;
  short sVar51;
  short sVar52;
  short sVar57;
  short sVar66;
  short sVar67;
  short sVar68;
  short sVar69;
  short sVar70;
  short sVar71;
  short sVar72;
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar21 = "profile";
  }
  else {
    pvVar3 = (profile->profile16).score;
    if (pvVar3 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar21 = "profile->profile16.score";
    }
    else {
      ppVar4 = profile->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar21 = "profile->matrix";
      }
      else {
        uVar16 = profile->s1Len;
        if ((int)uVar16 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar21 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar21 = "s2";
        }
        else if (s2Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar21 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar21 = "open";
        }
        else {
          if (-1 < gap) {
            local_1c8._0_4_ = gap;
            uVar23 = uVar16 - 1;
            uVar32 = (ulong)uVar16 + 7 >> 3;
            uVar37 = (ulong)uVar23 % uVar32;
            iVar25 = -open;
            iVar30 = ppVar4->min;
            iVar26 = -iVar30;
            if (iVar30 != iVar25 && SBORROW4(iVar30,iVar25) == iVar30 + open < 0) {
              iVar26 = open;
            }
            pvVar5 = (profile->profile16).matches;
            iVar30 = ppVar4->max;
            pvVar6 = (profile->profile16).similar;
            ppVar15 = parasail_result_new_rowcol3((uint)((ulong)uVar16 + 7) & 0x7ffffff8,s2Len);
            if (ppVar15 != (parasail_result_t *)0x0) {
              ppVar15->flag = ppVar15->flag | 0x8250401;
              b = parasail_memalign___m128i(0x10,uVar32);
              b_00 = parasail_memalign___m128i(0x10,uVar32);
              b_01 = parasail_memalign___m128i(0x10,uVar32);
              b_02 = parasail_memalign___m128i(0x10,uVar32);
              ptr = parasail_memalign___m128i(0x10,uVar32);
              b_03 = parasail_memalign___m128i(0x10,uVar32);
              b_04 = parasail_memalign___m128i(0x10,uVar32);
              local_1e8._8_8_ = local_1e8._0_8_;
              local_1e8._0_8_ = CONCAT44(0,s2Len);
              b_05 = parasail_memalign___m128i(0x10,uVar32);
              ptr_00 = parasail_memalign___m128i(0x10,uVar32);
              ptr_01 = parasail_memalign___m128i(0x10,uVar32);
              ptr_02 = parasail_memalign___m128i(0x10,uVar32);
              ptr_03 = parasail_memalign___m128i(0x10,uVar32);
              ptr_04 = parasail_memalign___m128i(0x10,uVar32);
              ptr_05 = parasail_memalign___m128i(0x10,uVar32);
              uVar27 = 0x10;
              ptr_06 = parasail_memalign_int16_t(0x10,(ulong)(s2Len + 1));
              auVar108._0_4_ = -(uint)((int)b == 0);
              auVar108._4_4_ = -(uint)((int)((ulong)b >> 0x20) == 0);
              auVar108._8_4_ = -(uint)((int)b_00 == 0);
              auVar108._12_4_ = -(uint)((int)((ulong)b_00 >> 0x20) == 0);
              auVar129._4_4_ = auVar108._0_4_;
              auVar129._0_4_ = auVar108._4_4_;
              auVar129._8_4_ = auVar108._12_4_;
              auVar129._12_4_ = auVar108._8_4_;
              auVar102._0_4_ = -(uint)((int)b_01 == 0);
              auVar102._4_4_ = -(uint)((int)((ulong)b_01 >> 0x20) == 0);
              auVar102._8_4_ = -(uint)((int)b_02 == 0);
              auVar102._12_4_ = -(uint)((int)((ulong)b_02 >> 0x20) == 0);
              auVar39._4_4_ = auVar102._0_4_;
              auVar39._0_4_ = auVar102._4_4_;
              auVar39._8_4_ = auVar102._12_4_;
              auVar39._12_4_ = auVar102._8_4_;
              auVar102 = packssdw(auVar129 & auVar108,auVar39 & auVar102);
              auVar38._0_4_ = -(uint)((int)ptr == 0);
              auVar38._4_4_ = -(uint)((int)((ulong)ptr >> 0x20) == 0);
              auVar38._8_4_ = -(uint)((int)b_03 == 0);
              auVar38._12_4_ = -(uint)((int)((ulong)b_03 >> 0x20) == 0);
              auVar62._4_4_ = auVar38._0_4_;
              auVar62._0_4_ = auVar38._4_4_;
              auVar62._8_4_ = auVar38._12_4_;
              auVar62._12_4_ = auVar38._8_4_;
              auVar103._0_4_ = -(uint)((int)b_04 == 0);
              auVar103._4_4_ = -(uint)((int)((ulong)b_04 >> 0x20) == 0);
              auVar103._8_4_ = -(uint)((int)b_05 == 0);
              auVar103._12_4_ = -(uint)((int)((ulong)b_05 >> 0x20) == 0);
              auVar97._4_4_ = auVar103._0_4_;
              auVar97._0_4_ = auVar103._4_4_;
              auVar97._8_4_ = auVar103._12_4_;
              auVar97._12_4_ = auVar103._8_4_;
              auVar96 = packssdw(auVar62 & auVar38,auVar97 & auVar103);
              auVar96 = packssdw(auVar102,auVar96);
              auVar103 = packsswb(auVar96,auVar96);
              auVar96._0_4_ = -(uint)((int)ptr_00 == 0 && (int)((ulong)ptr_00 >> 0x20) == 0);
              auVar96._4_4_ = -(uint)((int)ptr_01 == 0 && (int)((ulong)ptr_01 >> 0x20) == 0);
              auVar96._8_4_ = -(uint)((int)ptr_02 == 0 && (int)((ulong)ptr_02 >> 0x20) == 0);
              auVar96._12_4_ = -(uint)((int)ptr_03 == 0 && (int)((ulong)ptr_03 >> 0x20) == 0);
              uVar27 = movmskps(uVar27,auVar96);
              if (((ptr_05 != (__m128i *)0x0 && ptr_04 != (__m128i *)0x0) &&
                  ptr_06 != (int16_t *)0x0) &&
                  ((char)uVar27 == '\0' &&
                  ((((((((auVar103 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                        (auVar103 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar103 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar103 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar103 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar103 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar103 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar103 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0))) {
                iVar11 = s2Len + -1;
                iVar12 = 7 - (int)(uVar23 / uVar32);
                auVar96 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
                uVar27 = auVar96._0_4_;
                len = (size_t)(uint)gap;
                auVar96 = pshuflw(ZEXT416((uint)gap),ZEXT416((uint)gap),0);
                uVar35 = auVar96._0_4_;
                uVar13 = iVar26 - 0x7fff;
                auVar96 = pshuflw(ZEXT416(uVar13),ZEXT416(uVar13),0);
                local_128 = auVar96._0_2_;
                uStack_126 = auVar96._2_2_;
                auVar103 = ZEXT416((uint)CONCAT62((int6)((ulong)pvVar5 >> 0x10),
                                                  0x7ffe - (short)iVar30));
                auVar103 = pshuflw(auVar103,auVar103,0);
                uVar22 = (uint)uVar32;
                auVar38 = pshuflw(ZEXT416(uVar22),ZEXT416(uVar22),0);
                uVar36 = auVar38._0_4_;
                auVar38 = ZEXT416(-(uVar22 * gap));
                auVar38 = pshuflw(auVar38,auVar38,0);
                uVar16 = auVar38._0_4_;
                auVar106._0_8_ = CONCAT44(uVar16,uVar16);
                auVar106._8_4_ = uVar16;
                auVar106._12_4_ = uVar16;
                auVar75._0_8_ = auVar106._0_8_ << 0x10;
                auVar75._8_8_ = auVar106._8_8_ << 0x10 | (ulong)(uVar16 >> 0x10);
                auVar38 = paddsw(auVar75,ZEXT416(uVar13 & 0xffff));
                alVar151[1] = uVar32;
                alVar151[0] = uVar32;
                parasail_memset___m128i(b_03,alVar151,len);
                alVar59[1] = extraout_RDX;
                alVar59[0] = uVar32;
                parasail_memset___m128i(b_04,alVar59,len);
                c[1] = extraout_RDX_00;
                c[0] = uVar32;
                parasail_memset___m128i(b_05,c,len);
                c_00[1] = extraout_RDX_01;
                c_00[0] = uVar32;
                parasail_memset___m128i(b,c_00,len);
                c_01[1] = extraout_RDX_02;
                c_01[0] = uVar32;
                parasail_memset___m128i(b_00,c_01,len);
                c_02[1] = extraout_RDX_03;
                c_02[0] = uVar32;
                parasail_memset___m128i(b_01,c_02,len);
                c_03[1] = extraout_RDX_04;
                c_03[0] = uVar32;
                parasail_memset___m128i(b_02,c_03,len);
                alVar151 = _DAT_008a1ba0;
                auVar61._4_4_ = uVar27;
                auVar61._0_4_ = uVar27;
                auVar61._8_4_ = uVar27;
                auVar61._12_4_ = uVar27;
                alVar59 = (__m128i)psubsw(ZEXT816(0),auVar61);
                uVar14 = uVar22 - 1;
                alVar54 = _DAT_008a1ba0;
                for (uVar16 = uVar14; -1 < (int)uVar16; uVar16 = uVar16 - 1) {
                  ptr_04[uVar16] = alVar59;
                  ptr_05[uVar16] = alVar54;
                  auVar114._4_4_ = uVar35;
                  auVar114._0_4_ = uVar35;
                  auVar114._8_4_ = uVar35;
                  auVar114._12_4_ = uVar35;
                  alVar59 = (__m128i)psubsw((undefined1  [16])alVar59,auVar114);
                  alVar54 = (__m128i)paddsw((undefined1  [16])alVar54,(undefined1  [16])alVar151);
                }
                iVar30 = iVar25;
                for (uVar17 = 0; uVar17 != uVar32; uVar17 = uVar17 + 1) {
                  iVar26 = iVar30;
                  for (lVar28 = 0; lVar28 != 8; lVar28 = lVar28 + 1) {
                    uVar29 = 0x8000;
                    if (-0x8000 < iVar26) {
                      uVar29 = (undefined2)iVar26;
                    }
                    *(undefined2 *)((long)&h + lVar28 * 2) = uVar29;
                    iVar26 = iVar26 - uVar22 * gap;
                  }
                  ptr[uVar17][0] = h.m[0];
                  ptr[uVar17][1] = h.m[1];
                  iVar30 = iVar30 - gap;
                }
                *ptr_06 = 0;
                for (uVar17 = 1; s2Len + 1 != uVar17; uVar17 = uVar17 + 1) {
                  iVar24 = -0x8000;
                  if (-0x8000 < iVar25) {
                    iVar24 = (int16_t)iVar25;
                  }
                  ptr_06[uVar17] = iVar24;
                  iVar25 = iVar25 - gap;
                }
                local_118 = uVar36 << 0x10;
                uStack_110 = uVar36 << 0x10 | uVar36 >> 0x10;
                palVar18 = b_04 + uVar37;
                lVar28 = uVar32 << 4;
                local_88 = auVar103._0_2_;
                uStack_86 = auVar103._2_2_;
                uStack_114 = (undefined4)(CONCAT44(uVar36,uVar36) >> 0x10);
                uStack_10c = (undefined4)(CONCAT44(uVar36,uVar36) >> 0x10);
                palVar20 = palVar18;
                uVar17 = 0;
                uVar116 = local_128;
                uVar119 = uStack_126;
                uVar120 = local_128;
                uVar121 = uStack_126;
                uVar122 = local_128;
                uVar123 = uStack_126;
                uVar124 = local_128;
                uVar125 = uStack_126;
                uVar128 = local_88;
                uVar132 = uStack_86;
                uVar135 = local_88;
                uVar138 = uStack_86;
                uVar141 = local_88;
                uVar144 = uStack_86;
                uVar147 = local_88;
                uVar150 = uStack_86;
                while (uVar17 != CONCAT44(0,s2Len)) {
                  uVar53 = ptr[uVar14][0];
                  uVar58 = b_03[uVar14][0];
                  uVar74 = b_04[uVar14][0];
                  uVar90 = b_05[uVar14][0];
                  auVar113._0_8_ = uVar58 << 0x10;
                  auVar113._8_8_ = b_03[uVar14][1] << 0x10 | uVar58 >> 0x30;
                  auVar111._0_8_ = uVar74 << 0x10;
                  auVar111._8_8_ = b_04[uVar14][1] << 0x10 | uVar74 >> 0x30;
                  auVar112._0_8_ = uVar90 << 0x10;
                  auVar112._8_8_ = b_05[uVar14][1] << 0x10 | uVar90 >> 0x30;
                  auVar115._8_8_ = ptr[uVar14][1] << 0x10 | uVar53 >> 0x30;
                  auVar115._0_8_ = uVar53 << 0x10 | (ulong)(ushort)ptr_06[uVar17];
                  lVar31 = (long)(int)(ppVar4->mapper[(byte)s2[uVar17]] * uVar22) * 0x10;
                  auVar99._4_2_ = local_128;
                  auVar99._0_4_ = auVar96._0_4_;
                  auVar99._6_2_ = uStack_126;
                  auVar99._8_2_ = local_128;
                  auVar99._10_2_ = uStack_126;
                  auVar99._12_2_ = local_128;
                  auVar99._14_2_ = uStack_126;
                  auVar105 = psubsw(auVar99,(undefined1  [16])*ptr_04);
                  auVar103 = (undefined1  [16])0x0;
                  auVar97 = (undefined1  [16])0x0;
                  lVar19 = 0;
                  auVar102 = (undefined1  [16])0x0;
                  while( true ) {
                    sVar34 = auVar99._0_2_;
                    sVar46 = auVar99._2_2_;
                    sVar47 = auVar99._4_2_;
                    sVar48 = auVar99._6_2_;
                    sVar49 = auVar99._8_2_;
                    sVar50 = auVar99._10_2_;
                    sVar51 = auVar99._12_2_;
                    sVar52 = auVar99._14_2_;
                    if (lVar28 == lVar19) break;
                    auVar62 = *(undefined1 (*) [16])((long)*ptr + lVar19);
                    auVar108 = *(undefined1 (*) [16])((long)*b_03 + lVar19);
                    auVar7._4_4_ = uVar27;
                    auVar7._0_4_ = uVar27;
                    auVar7._8_4_ = uVar27;
                    auVar7._12_4_ = uVar27;
                    auVar39 = psubsw(auVar62,auVar7);
                    auVar9._4_4_ = uVar35;
                    auVar9._0_4_ = uVar35;
                    auVar9._8_4_ = uVar35;
                    auVar9._12_4_ = uVar35;
                    auVar129 = psubsw(*(undefined1 (*) [16])((long)*b + lVar19),auVar9);
                    sVar57 = auVar39._0_2_;
                    sVar126 = auVar129._0_2_;
                    auVar60._0_2_ = -(ushort)(sVar126 < sVar57);
                    sVar66 = auVar39._2_2_;
                    sVar130 = auVar129._2_2_;
                    auVar60._2_2_ = -(ushort)(sVar130 < sVar66);
                    sVar67 = auVar39._4_2_;
                    sVar133 = auVar129._4_2_;
                    auVar60._4_2_ = -(ushort)(sVar133 < sVar67);
                    sVar68 = auVar39._6_2_;
                    sVar136 = auVar129._6_2_;
                    auVar60._6_2_ = -(ushort)(sVar136 < sVar68);
                    sVar69 = auVar39._8_2_;
                    sVar139 = auVar129._8_2_;
                    auVar60._8_2_ = -(ushort)(sVar139 < sVar69);
                    sVar70 = auVar39._10_2_;
                    sVar142 = auVar129._10_2_;
                    auVar60._10_2_ = -(ushort)(sVar142 < sVar70);
                    sVar71 = auVar39._12_2_;
                    sVar145 = auVar129._12_2_;
                    sVar72 = auVar39._14_2_;
                    auVar60._12_2_ = -(ushort)(sVar145 < sVar71);
                    sVar148 = auVar129._14_2_;
                    auVar60._14_2_ = -(ushort)(sVar148 < sVar72);
                    uVar127 = (ushort)(sVar126 < sVar57) * sVar57 |
                              (ushort)(sVar126 >= sVar57) * sVar126;
                    uVar131 = (ushort)(sVar130 < sVar66) * sVar66 |
                              (ushort)(sVar130 >= sVar66) * sVar130;
                    uVar134 = (ushort)(sVar133 < sVar67) * sVar67 |
                              (ushort)(sVar133 >= sVar67) * sVar133;
                    uVar137 = (ushort)(sVar136 < sVar68) * sVar68 |
                              (ushort)(sVar136 >= sVar68) * sVar136;
                    uVar140 = (ushort)(sVar139 < sVar69) * sVar69 |
                              (ushort)(sVar139 >= sVar69) * sVar139;
                    uVar143 = (ushort)(sVar142 < sVar70) * sVar70 |
                              (ushort)(sVar142 >= sVar70) * sVar142;
                    uVar146 = (ushort)(sVar145 < sVar71) * sVar71 |
                              (ushort)(sVar145 >= sVar71) * sVar145;
                    uVar149 = (ushort)(sVar148 < sVar72) * sVar72 |
                              (ushort)(sVar148 >= sVar72) * sVar148;
                    auVar117 = auVar108 & auVar60 |
                               ~auVar60 & *(undefined1 (*) [16])((long)*b_00 + lVar19);
                    auVar39 = *(undefined1 (*) [16])((long)*b_04 + lVar19);
                    auVar75 = auVar39 & auVar60 |
                              ~auVar60 & *(undefined1 (*) [16])((long)*b_01 + lVar19);
                    auVar129 = *(undefined1 (*) [16])((long)*b_05 + lVar19);
                    auVar61 = *(undefined1 (*) [16])((long)*b_02 + lVar19);
                    auVar106 = paddsw(auVar105,*(undefined1 (*) [16])((long)*ptr_04 + lVar19));
                    sVar57 = auVar106._0_2_;
                    auVar91._0_2_ = -(ushort)(sVar34 < sVar57);
                    sVar66 = auVar106._2_2_;
                    auVar91._2_2_ = -(ushort)(sVar46 < sVar66);
                    sVar67 = auVar106._4_2_;
                    auVar91._4_2_ = -(ushort)(sVar47 < sVar67);
                    sVar68 = auVar106._6_2_;
                    auVar91._6_2_ = -(ushort)(sVar48 < sVar68);
                    sVar69 = auVar106._8_2_;
                    auVar91._8_2_ = -(ushort)(sVar49 < sVar69);
                    sVar70 = auVar106._10_2_;
                    auVar91._10_2_ = -(ushort)(sVar50 < sVar70);
                    sVar71 = auVar106._12_2_;
                    sVar72 = auVar106._14_2_;
                    auVar91._12_2_ = -(ushort)(sVar51 < sVar71);
                    auVar91._14_2_ = -(ushort)(sVar52 < sVar72);
                    auVar99._0_2_ =
                         (ushort)(sVar34 < sVar57) * sVar57 | (ushort)(sVar34 >= sVar57) * sVar34;
                    auVar99._2_2_ =
                         (ushort)(sVar46 < sVar66) * sVar66 | (ushort)(sVar46 >= sVar66) * sVar46;
                    auVar99._4_2_ =
                         (ushort)(sVar47 < sVar67) * sVar67 | (ushort)(sVar47 >= sVar67) * sVar47;
                    auVar99._6_2_ =
                         (ushort)(sVar48 < sVar68) * sVar68 | (ushort)(sVar48 >= sVar68) * sVar48;
                    auVar99._8_2_ =
                         (ushort)(sVar49 < sVar69) * sVar69 | (ushort)(sVar49 >= sVar69) * sVar49;
                    auVar99._10_2_ =
                         (ushort)(sVar50 < sVar70) * sVar70 | (ushort)(sVar50 >= sVar70) * sVar50;
                    auVar99._12_2_ =
                         (ushort)(sVar51 < sVar71) * sVar71 | (ushort)(sVar51 >= sVar71) * sVar51;
                    auVar99._14_2_ =
                         (ushort)(sVar52 < sVar72) * sVar72 | (ushort)(sVar52 >= sVar72) * sVar52;
                    auVar97 = local_1c8 & auVar91 | ~auVar91 & auVar97;
                    auVar106 = paddsw((undefined1  [16])alVar54,
                                      *(undefined1 (*) [16])((long)*ptr_05 + lVar19));
                    auVar102 = local_1e8 & auVar91 | ~auVar91 & auVar102;
                    auVar103 = ~auVar91 & auVar103 | auVar106 & auVar91;
                    auVar115 = paddsw(auVar115,*(undefined1 (*) [16])
                                                ((long)pvVar3 + lVar19 + lVar31));
                    auVar114 = paddsw(auVar113,*(undefined1 (*) [16])
                                                ((long)pvVar5 + lVar19 + lVar31));
                    auVar106 = paddsw(auVar111,*(undefined1 (*) [16])
                                                ((long)pvVar6 + lVar19 + lVar31));
                    sVar34 = auVar115._0_2_;
                    auVar55._0_2_ = -(ushort)(sVar34 < (short)uVar127);
                    sVar46 = auVar115._2_2_;
                    auVar55._2_2_ = -(ushort)(sVar46 < (short)uVar131);
                    sVar47 = auVar115._4_2_;
                    auVar55._4_2_ = -(ushort)(sVar47 < (short)uVar134);
                    sVar48 = auVar115._6_2_;
                    auVar55._6_2_ = -(ushort)(sVar48 < (short)uVar137);
                    sVar49 = auVar115._8_2_;
                    auVar55._8_2_ = -(ushort)(sVar49 < (short)uVar140);
                    sVar50 = auVar115._10_2_;
                    auVar55._10_2_ = -(ushort)(sVar50 < (short)uVar143);
                    sVar51 = auVar115._12_2_;
                    auVar55._12_2_ = -(ushort)(sVar51 < (short)uVar146);
                    sVar52 = auVar115._14_2_;
                    auVar55._14_2_ = -(ushort)(sVar52 < (short)uVar149);
                    puVar1 = (ushort *)((long)*b + lVar19);
                    *puVar1 = uVar127;
                    puVar1[1] = uVar131;
                    puVar1[2] = uVar134;
                    puVar1[3] = uVar137;
                    puVar1[4] = uVar140;
                    puVar1[5] = uVar143;
                    puVar1[6] = uVar146;
                    puVar1[7] = uVar149;
                    *(undefined1 (*) [16])((long)*b_00 + lVar19) = auVar117;
                    local_1c8 = ~auVar55 & auVar114 | auVar117 & auVar55;
                    *(undefined1 (*) [16])((long)*b_01 + lVar19) = auVar75;
                    local_1e8 = ~auVar55 & auVar106 | auVar75 & auVar55;
                    auVar61 = paddsw(~auVar60 & auVar61 | auVar129 & auVar60,
                                     (undefined1  [16])_DAT_008a1ba0);
                    auVar75 = paddsw(auVar112,(undefined1  [16])_DAT_008a1ba0);
                    *(undefined1 (*) [16])((long)*b_02 + lVar19) = auVar61;
                    alVar54 = (__m128i)(~auVar55 & auVar75 | auVar61 & auVar55);
                    auVar105._0_2_ =
                         (ushort)((short)uVar127 < sVar34) * sVar34 |
                         ((short)uVar127 >= sVar34) * uVar127;
                    auVar105._2_2_ =
                         (ushort)((short)uVar131 < sVar46) * sVar46 |
                         ((short)uVar131 >= sVar46) * uVar131;
                    auVar105._4_2_ =
                         (ushort)((short)uVar134 < sVar47) * sVar47 |
                         ((short)uVar134 >= sVar47) * uVar134;
                    auVar105._6_2_ =
                         (ushort)((short)uVar137 < sVar48) * sVar48 |
                         ((short)uVar137 >= sVar48) * uVar137;
                    auVar105._8_2_ =
                         (ushort)((short)uVar140 < sVar49) * sVar49 |
                         ((short)uVar140 >= sVar49) * uVar140;
                    auVar105._10_2_ =
                         (ushort)((short)uVar143 < sVar50) * sVar50 |
                         ((short)uVar143 >= sVar50) * uVar143;
                    auVar105._12_2_ =
                         (ushort)((short)uVar146 < sVar51) * sVar51 |
                         ((short)uVar146 >= sVar51) * uVar146;
                    auVar105._14_2_ =
                         (ushort)((short)uVar149 < sVar52) * sVar52 |
                         ((short)uVar149 >= sVar52) * uVar149;
                    *(undefined1 (*) [16])((long)*ptr + lVar19) = auVar115;
                    *(undefined1 (*) [16])((long)*b_03 + lVar19) = auVar114;
                    *(undefined1 (*) [16])((long)*b_04 + lVar19) = auVar106;
                    *(undefined1 (*) [16])((long)*b_05 + lVar19) = auVar75;
                    lVar19 = lVar19 + 0x10;
                    auVar111 = auVar39;
                    auVar112 = auVar129;
                    auVar113 = auVar108;
                    auVar115 = auVar62;
                  }
                  auVar92._0_8_ = local_1c8._0_8_ << 0x10;
                  auVar92._8_8_ = local_1c8._8_8_ << 0x10 | (ulong)local_1c8._0_8_ >> 0x30;
                  auVar76._0_8_ = local_1e8._0_8_ << 0x10;
                  auVar76._8_8_ = local_1e8._8_8_ << 0x10 | (ulong)local_1e8._0_8_ >> 0x30;
                  lVar19 = alVar54[1];
                  uVar53 = alVar54[0];
                  alVar54[0] = uVar53 << 0x10;
                  alVar54[1] = lVar19 << 0x10 | uVar53 >> 0x30;
                  auVar107._8_8_ = auVar105._8_8_ << 0x10 | auVar105._0_8_ >> 0x30;
                  uVar127 = ptr_06[uVar17 + 1];
                  auVar107._0_8_ = auVar105._0_8_ << 0x10 | (ulong)uVar127;
                  auVar62 = paddsw((undefined1  [16])*ptr_04,auVar107);
                  sVar57 = auVar62._0_2_;
                  auVar40._0_2_ =
                       (ushort)(sVar34 < sVar57) * sVar57 | (ushort)(sVar34 >= sVar57) * sVar34;
                  sVar66 = auVar62._2_2_;
                  auVar40._2_2_ =
                       (ushort)(sVar46 < sVar66) * sVar66 | (ushort)(sVar46 >= sVar66) * sVar46;
                  sVar67 = auVar62._4_2_;
                  auVar40._4_2_ =
                       (ushort)(sVar47 < sVar67) * sVar67 | (ushort)(sVar47 >= sVar67) * sVar47;
                  sVar68 = auVar62._6_2_;
                  auVar40._6_2_ =
                       (ushort)(sVar48 < sVar68) * sVar68 | (ushort)(sVar48 >= sVar68) * sVar48;
                  sVar69 = auVar62._8_2_;
                  auVar40._8_2_ =
                       (ushort)(sVar49 < sVar69) * sVar69 | (ushort)(sVar49 >= sVar69) * sVar49;
                  sVar70 = auVar62._10_2_;
                  auVar40._10_2_ =
                       (ushort)(sVar50 < sVar70) * sVar70 | (ushort)(sVar50 >= sVar70) * sVar50;
                  sVar71 = auVar62._12_2_;
                  auVar40._12_2_ =
                       (ushort)(sVar51 < sVar71) * sVar71 | (ushort)(sVar51 >= sVar71) * sVar51;
                  sVar72 = auVar62._14_2_;
                  auVar40._14_2_ =
                       (ushort)(sVar52 < sVar72) * sVar72 | (ushort)(sVar52 >= sVar72) * sVar52;
                  auVar100._0_2_ = -(ushort)(sVar57 < sVar34);
                  auVar100._2_2_ = -(ushort)(sVar66 < sVar46);
                  auVar100._4_2_ = -(ushort)(sVar67 < sVar47);
                  auVar100._6_2_ = -(ushort)(sVar68 < sVar48);
                  auVar100._8_2_ = -(ushort)(sVar69 < sVar49);
                  auVar100._10_2_ = -(ushort)(sVar70 < sVar50);
                  auVar100._12_2_ = -(ushort)(sVar71 < sVar51);
                  auVar100._14_2_ = -(ushort)(sVar72 < sVar52);
                  auVar62 = auVar97 & auVar100 | ~auVar100 & auVar92;
                  auVar102 = auVar102 & auVar100 | ~auVar100 & auVar76;
                  auVar97 = paddsw((undefined1  [16])*ptr_05,(undefined1  [16])alVar54);
                  auVar103 = ~auVar100 & auVar97 | auVar103 & auVar100;
                  iVar30 = 6;
                  auVar117._4_4_ = uStack_114;
                  auVar117._0_4_ = local_118;
                  auVar117._8_4_ = uStack_110;
                  auVar117._12_4_ = uStack_10c;
                  while( true ) {
                    auVar110._0_8_ = auVar103._0_8_ << 0x10;
                    auVar110._8_8_ = auVar103._8_8_ << 0x10 | auVar103._0_8_ >> 0x30;
                    auVar77._0_8_ = auVar40._0_8_ << 0x10;
                    auVar77._8_8_ = auVar40._8_8_ << 0x10 | auVar40._0_8_ >> 0x30;
                    auVar101._0_8_ = auVar62._0_8_ << 0x10;
                    auVar101._8_8_ = auVar62._8_8_ << 0x10 | auVar62._0_8_ >> 0x30;
                    auVar98._0_8_ = auVar102._0_8_ << 0x10;
                    auVar98._8_8_ = auVar102._8_8_ << 0x10 | auVar102._0_8_ >> 0x30;
                    bVar33 = iVar30 == 0;
                    iVar30 = iVar30 + -1;
                    if (bVar33) break;
                    auVar97 = paddsw(auVar77,auVar38);
                    sVar34 = auVar97._0_2_;
                    sVar57 = auVar40._0_2_;
                    auVar63._0_2_ =
                         (ushort)(sVar57 < sVar34) * sVar34 | (ushort)(sVar57 >= sVar34) * sVar57;
                    sVar46 = auVar97._2_2_;
                    sVar66 = auVar40._2_2_;
                    auVar63._2_2_ =
                         (ushort)(sVar66 < sVar46) * sVar46 | (ushort)(sVar66 >= sVar46) * sVar66;
                    sVar47 = auVar97._4_2_;
                    sVar67 = auVar40._4_2_;
                    auVar63._4_2_ =
                         (ushort)(sVar67 < sVar47) * sVar47 | (ushort)(sVar67 >= sVar47) * sVar67;
                    sVar48 = auVar97._6_2_;
                    sVar68 = auVar40._6_2_;
                    auVar63._6_2_ =
                         (ushort)(sVar68 < sVar48) * sVar48 | (ushort)(sVar68 >= sVar48) * sVar68;
                    sVar49 = auVar97._8_2_;
                    sVar69 = auVar40._8_2_;
                    auVar63._8_2_ =
                         (ushort)(sVar69 < sVar49) * sVar49 | (ushort)(sVar69 >= sVar49) * sVar69;
                    sVar50 = auVar97._10_2_;
                    sVar70 = auVar40._10_2_;
                    auVar63._10_2_ =
                         (ushort)(sVar70 < sVar50) * sVar50 | (ushort)(sVar70 >= sVar50) * sVar70;
                    sVar51 = auVar97._12_2_;
                    sVar71 = auVar40._12_2_;
                    sVar72 = auVar40._14_2_;
                    auVar63._12_2_ =
                         (ushort)(sVar71 < sVar51) * sVar51 | (ushort)(sVar71 >= sVar51) * sVar71;
                    sVar52 = auVar97._14_2_;
                    auVar63._14_2_ =
                         (ushort)(sVar72 < sVar52) * sVar52 | (ushort)(sVar72 >= sVar52) * sVar72;
                    auVar41._0_2_ = -(ushort)(sVar34 < sVar57);
                    auVar41._2_2_ = -(ushort)(sVar46 < sVar66);
                    auVar41._4_2_ = -(ushort)(sVar47 < sVar67);
                    auVar41._6_2_ = -(ushort)(sVar48 < sVar68);
                    auVar41._8_2_ = -(ushort)(sVar49 < sVar69);
                    auVar41._10_2_ = -(ushort)(sVar50 < sVar70);
                    auVar41._12_2_ = -(ushort)(sVar51 < sVar71);
                    auVar41._14_2_ = -(ushort)(sVar52 < sVar72);
                    auVar62 = auVar62 & auVar41 | ~auVar41 & auVar101;
                    auVar102 = auVar102 & auVar41 | ~auVar41 & auVar98;
                    auVar97 = paddsw(auVar110,auVar117);
                    auVar103 = auVar103 & auVar41 | ~auVar41 & auVar97;
                    auVar40 = auVar63;
                  }
                  auVar78 = paddsw(auVar77,ZEXT416(uVar13 & 0xffff));
                  sVar34 = auVar78._0_2_;
                  auVar42._0_2_ = -(ushort)((short)uVar127 < sVar34);
                  sVar46 = auVar78._2_2_;
                  sVar57 = auVar105._0_2_;
                  auVar42._2_2_ = -(ushort)(sVar57 < sVar46);
                  sVar47 = auVar78._4_2_;
                  sVar66 = auVar105._2_2_;
                  auVar42._4_2_ = -(ushort)(sVar66 < sVar47);
                  sVar48 = auVar78._6_2_;
                  sVar67 = auVar105._4_2_;
                  auVar42._6_2_ = -(ushort)(sVar67 < sVar48);
                  sVar49 = auVar78._8_2_;
                  sVar68 = auVar105._6_2_;
                  auVar42._8_2_ = -(ushort)(sVar68 < sVar49);
                  sVar50 = auVar78._10_2_;
                  sVar69 = auVar105._8_2_;
                  auVar42._10_2_ = -(ushort)(sVar69 < sVar50);
                  sVar51 = auVar78._12_2_;
                  sVar70 = auVar105._10_2_;
                  sVar52 = auVar78._14_2_;
                  auVar42._12_2_ = -(ushort)(sVar70 < sVar51);
                  sVar71 = auVar105._12_2_;
                  auVar42._14_2_ = -(ushort)(sVar71 < sVar52);
                  auVar43._0_2_ =
                       (ushort)((short)uVar127 < sVar34) * sVar34 |
                       ((short)uVar127 >= sVar34) * uVar127;
                  auVar43._2_2_ =
                       (ushort)(sVar57 < sVar46) * sVar46 | (ushort)(sVar57 >= sVar46) * sVar57;
                  auVar43._4_2_ =
                       (ushort)(sVar66 < sVar47) * sVar47 | (ushort)(sVar66 >= sVar47) * sVar66;
                  auVar43._6_2_ =
                       (ushort)(sVar67 < sVar48) * sVar48 | (ushort)(sVar67 >= sVar48) * sVar67;
                  auVar43._8_2_ =
                       (ushort)(sVar68 < sVar49) * sVar49 | (ushort)(sVar68 >= sVar49) * sVar68;
                  auVar43._10_2_ =
                       (ushort)(sVar69 < sVar50) * sVar50 | (ushort)(sVar69 >= sVar50) * sVar69;
                  auVar43._12_2_ =
                       (ushort)(sVar70 < sVar51) * sVar51 | (ushort)(sVar70 >= sVar51) * sVar70;
                  auVar43._14_2_ =
                       (ushort)(sVar71 < sVar52) * sVar52 | (ushort)(sVar71 >= sVar52) * sVar71;
                  auVar102 = auVar101 & auVar42 | ~auVar42 & auVar92;
                  auVar97 = auVar98 & auVar42 | ~auVar42 & auVar76;
                  auVar103 = ~auVar42 & (undefined1  [16])alVar54 | auVar110 & auVar42;
                  for (lVar19 = 0; lVar28 != lVar19; lVar19 = lVar19 + 0x10) {
                    puVar1 = (ushort *)((long)*ptr + lVar19);
                    uVar127 = *puVar1;
                    uVar131 = puVar1[1];
                    uVar134 = puVar1[2];
                    uVar137 = puVar1[3];
                    uVar140 = puVar1[4];
                    uVar143 = puVar1[5];
                    uVar146 = puVar1[6];
                    uVar149 = puVar1[7];
                    auVar8._4_4_ = uVar27;
                    auVar8._0_4_ = uVar27;
                    auVar8._8_4_ = uVar27;
                    auVar8._12_4_ = uVar27;
                    auVar108 = psubsw(auVar43,auVar8);
                    auVar10._4_4_ = uVar35;
                    auVar10._0_4_ = uVar35;
                    auVar10._8_4_ = uVar35;
                    auVar10._12_4_ = uVar35;
                    auVar62 = psubsw(auVar78,auVar10);
                    sVar34 = auVar62._0_2_;
                    sVar57 = auVar108._0_2_;
                    auVar78._0_2_ =
                         (ushort)(sVar57 < sVar34) * sVar34 | (ushort)(sVar57 >= sVar34) * sVar57;
                    sVar46 = auVar62._2_2_;
                    sVar66 = auVar108._2_2_;
                    auVar78._2_2_ =
                         (ushort)(sVar66 < sVar46) * sVar46 | (ushort)(sVar66 >= sVar46) * sVar66;
                    sVar47 = auVar62._4_2_;
                    sVar67 = auVar108._4_2_;
                    auVar78._4_2_ =
                         (ushort)(sVar67 < sVar47) * sVar47 | (ushort)(sVar67 >= sVar47) * sVar67;
                    sVar48 = auVar62._6_2_;
                    sVar68 = auVar108._6_2_;
                    auVar78._6_2_ =
                         (ushort)(sVar68 < sVar48) * sVar48 | (ushort)(sVar68 >= sVar48) * sVar68;
                    sVar49 = auVar62._8_2_;
                    sVar69 = auVar108._8_2_;
                    auVar78._8_2_ =
                         (ushort)(sVar69 < sVar49) * sVar49 | (ushort)(sVar69 >= sVar49) * sVar69;
                    sVar50 = auVar62._10_2_;
                    sVar70 = auVar108._10_2_;
                    auVar78._10_2_ =
                         (ushort)(sVar70 < sVar50) * sVar50 | (ushort)(sVar70 >= sVar50) * sVar70;
                    sVar51 = auVar62._12_2_;
                    sVar71 = auVar108._12_2_;
                    sVar72 = auVar108._14_2_;
                    auVar78._12_2_ =
                         (ushort)(sVar71 < sVar51) * sVar51 | (ushort)(sVar71 >= sVar51) * sVar71;
                    sVar52 = auVar62._14_2_;
                    auVar78._14_2_ =
                         (ushort)(sVar72 < sVar52) * sVar52 | (ushort)(sVar72 >= sVar52) * sVar72;
                    auVar109._0_2_ = -(ushort)(sVar34 < sVar57);
                    auVar109._2_2_ = -(ushort)(sVar46 < sVar66);
                    auVar109._4_2_ = -(ushort)(sVar47 < sVar67);
                    auVar109._6_2_ = -(ushort)(sVar48 < sVar68);
                    auVar109._8_2_ = -(ushort)(sVar49 < sVar69);
                    auVar109._10_2_ = -(ushort)(sVar50 < sVar70);
                    auVar109._12_2_ = -(ushort)(sVar51 < sVar71);
                    auVar109._14_2_ = -(ushort)(sVar52 < sVar72);
                    auVar101 = auVar102 & auVar109 | ~auVar109 & auVar101;
                    auVar98 = auVar97 & auVar109 | ~auVar109 & auVar98;
                    auVar110 = paddsw(~auVar109 & auVar110 | auVar103 & auVar109,
                                      (undefined1  [16])_DAT_008a1ba0);
                    psVar2 = (short *)((long)*b + lVar19);
                    sVar34 = *psVar2;
                    sVar46 = psVar2[1];
                    sVar47 = psVar2[2];
                    sVar48 = psVar2[3];
                    sVar49 = psVar2[4];
                    sVar50 = psVar2[5];
                    sVar51 = psVar2[6];
                    sVar52 = psVar2[7];
                    uVar73 = (sVar34 < (short)uVar127) * uVar127 |
                             (ushort)(sVar34 >= (short)uVar127) * sVar34;
                    uVar82 = (sVar46 < (short)uVar131) * uVar131 |
                             (ushort)(sVar46 >= (short)uVar131) * sVar46;
                    uVar83 = (sVar47 < (short)uVar134) * uVar134 |
                             (ushort)(sVar47 >= (short)uVar134) * sVar47;
                    uVar84 = (sVar48 < (short)uVar137) * uVar137 |
                             (ushort)(sVar48 >= (short)uVar137) * sVar48;
                    uVar85 = (sVar49 < (short)uVar140) * uVar140 |
                             (ushort)(sVar49 >= (short)uVar140) * sVar49;
                    uVar87 = (sVar50 < (short)uVar143) * uVar143 |
                             (ushort)(sVar50 >= (short)uVar143) * sVar50;
                    uVar88 = (sVar51 < (short)uVar146) * uVar146 |
                             (ushort)(sVar51 >= (short)uVar146) * sVar51;
                    uVar89 = (sVar52 < (short)uVar149) * uVar149 |
                             (ushort)(sVar52 >= (short)uVar149) * sVar52;
                    auVar43._0_2_ =
                         ((short)uVar73 < (short)auVar78._0_2_) * auVar78._0_2_ |
                         ((short)uVar73 >= (short)auVar78._0_2_) * uVar73;
                    auVar43._2_2_ =
                         ((short)uVar82 < (short)auVar78._2_2_) * auVar78._2_2_ |
                         ((short)uVar82 >= (short)auVar78._2_2_) * uVar82;
                    auVar43._4_2_ =
                         ((short)uVar83 < (short)auVar78._4_2_) * auVar78._4_2_ |
                         ((short)uVar83 >= (short)auVar78._4_2_) * uVar83;
                    auVar43._6_2_ =
                         ((short)uVar84 < (short)auVar78._6_2_) * auVar78._6_2_ |
                         ((short)uVar84 >= (short)auVar78._6_2_) * uVar84;
                    auVar43._8_2_ =
                         ((short)uVar85 < (short)auVar78._8_2_) * auVar78._8_2_ |
                         ((short)uVar85 >= (short)auVar78._8_2_) * uVar85;
                    auVar43._10_2_ =
                         ((short)uVar87 < (short)auVar78._10_2_) * auVar78._10_2_ |
                         ((short)uVar87 >= (short)auVar78._10_2_) * uVar87;
                    auVar43._12_2_ =
                         ((short)uVar88 < (short)auVar78._12_2_) * auVar78._12_2_ |
                         ((short)uVar88 >= (short)auVar78._12_2_) * uVar88;
                    auVar43._14_2_ =
                         ((short)uVar89 < (short)auVar78._14_2_) * auVar78._14_2_ |
                         ((short)uVar89 >= (short)auVar78._14_2_) * uVar89;
                    auVar104._0_2_ = -(ushort)(uVar127 == auVar43._0_2_);
                    auVar104._2_2_ = -(ushort)(uVar131 == auVar43._2_2_);
                    auVar104._4_2_ = -(ushort)(uVar134 == auVar43._4_2_);
                    auVar104._6_2_ = -(ushort)(uVar137 == auVar43._6_2_);
                    auVar104._8_2_ = -(ushort)(uVar140 == auVar43._8_2_);
                    auVar104._10_2_ = -(ushort)(uVar143 == auVar43._10_2_);
                    auVar104._12_2_ = -(ushort)(uVar146 == auVar43._12_2_);
                    auVar104._14_2_ = -(ushort)(uVar149 == auVar43._14_2_);
                    auVar79._0_2_ = -(ushort)((short)auVar78._0_2_ < (short)uVar73);
                    auVar79._2_2_ = -(ushort)((short)auVar78._2_2_ < (short)uVar82);
                    auVar79._4_2_ = -(ushort)((short)auVar78._4_2_ < (short)uVar83);
                    auVar79._6_2_ = -(ushort)((short)auVar78._6_2_ < (short)uVar84);
                    auVar79._8_2_ = -(ushort)((short)auVar78._8_2_ < (short)uVar85);
                    auVar79._10_2_ = -(ushort)((short)auVar78._10_2_ < (short)uVar87);
                    auVar79._12_2_ = -(ushort)((short)auVar78._12_2_ < (short)uVar88);
                    auVar79._14_2_ = -(ushort)((short)auVar78._14_2_ < (short)uVar89);
                    auVar102 = *(undefined1 (*) [16])((long)*b_03 + lVar19) & auVar104 |
                               ~auVar104 &
                               (~auVar79 & auVar101 |
                               *(undefined1 (*) [16])((long)*b_00 + lVar19) & auVar79);
                    auVar97 = *(undefined1 (*) [16])((long)*b_04 + lVar19) & auVar104 |
                              ~auVar104 &
                              (~auVar79 & auVar98 |
                              *(undefined1 (*) [16])((long)*b_01 + lVar19) & auVar79);
                    auVar103 = auVar104 & *(undefined1 (*) [16])((long)*b_05 + lVar19) |
                               ~auVar104 &
                               (~auVar79 & auVar110 |
                               *(undefined1 (*) [16])((long)*b_02 + lVar19) & auVar79);
                    *(undefined1 (*) [16])((long)*ptr + lVar19) = auVar43;
                    *(undefined1 (*) [16])((long)*b_03 + lVar19) = auVar102;
                    *(undefined1 (*) [16])((long)*b_04 + lVar19) = auVar97;
                    *(undefined1 (*) [16])((long)*b_05 + lVar19) = auVar103;
                    uVar128 = ((short)auVar43._0_2_ < (short)uVar128) * auVar43._0_2_ |
                              ((short)auVar43._0_2_ >= (short)uVar128) * uVar128;
                    uVar132 = ((short)auVar43._2_2_ < (short)uVar132) * auVar43._2_2_ |
                              ((short)auVar43._2_2_ >= (short)uVar132) * uVar132;
                    uVar135 = ((short)auVar43._4_2_ < (short)uVar135) * auVar43._4_2_ |
                              ((short)auVar43._4_2_ >= (short)uVar135) * uVar135;
                    uVar138 = ((short)auVar43._6_2_ < (short)uVar138) * auVar43._6_2_ |
                              ((short)auVar43._6_2_ >= (short)uVar138) * uVar138;
                    uVar141 = ((short)auVar43._8_2_ < (short)uVar141) * auVar43._8_2_ |
                              ((short)auVar43._8_2_ >= (short)uVar141) * uVar141;
                    uVar144 = ((short)auVar43._10_2_ < (short)uVar144) * auVar43._10_2_ |
                              ((short)auVar43._10_2_ >= (short)uVar144) * uVar144;
                    uVar147 = ((short)auVar43._12_2_ < (short)uVar147) * auVar43._12_2_ |
                              ((short)auVar43._12_2_ >= (short)uVar147) * uVar147;
                    uVar150 = ((short)auVar43._14_2_ < (short)uVar150) * auVar43._14_2_ |
                              ((short)auVar43._14_2_ >= (short)uVar150) * uVar150;
                    uVar116 = ((short)uVar116 < (short)auVar43._0_2_) * auVar43._0_2_ |
                              ((short)uVar116 >= (short)auVar43._0_2_) * uVar116;
                    uVar119 = ((short)uVar119 < (short)auVar43._2_2_) * auVar43._2_2_ |
                              ((short)uVar119 >= (short)auVar43._2_2_) * uVar119;
                    uVar120 = ((short)uVar120 < (short)auVar43._4_2_) * auVar43._4_2_ |
                              ((short)uVar120 >= (short)auVar43._4_2_) * uVar120;
                    uVar121 = ((short)uVar121 < (short)auVar43._6_2_) * auVar43._6_2_ |
                              ((short)uVar121 >= (short)auVar43._6_2_) * uVar121;
                    uVar122 = ((short)uVar122 < (short)auVar43._8_2_) * auVar43._8_2_ |
                              ((short)uVar122 >= (short)auVar43._8_2_) * uVar122;
                    uVar123 = ((short)uVar123 < (short)auVar43._10_2_) * auVar43._10_2_ |
                              ((short)uVar123 >= (short)auVar43._10_2_) * uVar123;
                    uVar124 = ((short)uVar124 < (short)auVar43._12_2_) * auVar43._12_2_ |
                              ((short)uVar124 >= (short)auVar43._12_2_) * uVar124;
                    uVar125 = ((short)uVar125 < (short)auVar43._14_2_) * auVar43._14_2_ |
                              ((short)uVar125 >= (short)auVar43._14_2_) * uVar125;
                    sVar34 = auVar102._0_2_;
                    uVar127 = (ushort)((short)uVar116 < sVar34) * sVar34 |
                              ((short)uVar116 >= sVar34) * uVar116;
                    sVar34 = auVar102._2_2_;
                    uVar131 = (ushort)((short)uVar119 < sVar34) * sVar34 |
                              ((short)uVar119 >= sVar34) * uVar119;
                    sVar34 = auVar102._4_2_;
                    uVar134 = (ushort)((short)uVar120 < sVar34) * sVar34 |
                              ((short)uVar120 >= sVar34) * uVar120;
                    sVar34 = auVar102._6_2_;
                    uVar137 = (ushort)((short)uVar121 < sVar34) * sVar34 |
                              ((short)uVar121 >= sVar34) * uVar121;
                    sVar34 = auVar102._8_2_;
                    uVar140 = (ushort)((short)uVar122 < sVar34) * sVar34 |
                              ((short)uVar122 >= sVar34) * uVar122;
                    sVar34 = auVar102._10_2_;
                    uVar143 = (ushort)((short)uVar123 < sVar34) * sVar34 |
                              ((short)uVar123 >= sVar34) * uVar123;
                    sVar34 = auVar102._12_2_;
                    uVar146 = (ushort)((short)uVar124 < sVar34) * sVar34 |
                              ((short)uVar124 >= sVar34) * uVar124;
                    sVar34 = auVar102._14_2_;
                    uVar149 = (ushort)((short)uVar125 < sVar34) * sVar34 |
                              ((short)uVar125 >= sVar34) * uVar125;
                    sVar34 = auVar103._0_2_;
                    sVar46 = auVar97._0_2_;
                    uVar116 = (ushort)(sVar46 < sVar34) * sVar34 |
                              (ushort)(sVar46 >= sVar34) * sVar46;
                    sVar34 = auVar103._2_2_;
                    sVar46 = auVar97._2_2_;
                    uVar119 = (ushort)(sVar46 < sVar34) * sVar34 |
                              (ushort)(sVar46 >= sVar34) * sVar46;
                    sVar34 = auVar103._4_2_;
                    sVar46 = auVar97._4_2_;
                    uVar120 = (ushort)(sVar46 < sVar34) * sVar34 |
                              (ushort)(sVar46 >= sVar34) * sVar46;
                    sVar34 = auVar103._6_2_;
                    sVar46 = auVar97._6_2_;
                    uVar121 = (ushort)(sVar46 < sVar34) * sVar34 |
                              (ushort)(sVar46 >= sVar34) * sVar46;
                    sVar34 = auVar103._8_2_;
                    sVar46 = auVar97._8_2_;
                    uVar122 = (ushort)(sVar46 < sVar34) * sVar34 |
                              (ushort)(sVar46 >= sVar34) * sVar46;
                    sVar34 = auVar103._10_2_;
                    sVar46 = auVar97._10_2_;
                    uVar123 = (ushort)(sVar46 < sVar34) * sVar34 |
                              (ushort)(sVar46 >= sVar34) * sVar46;
                    sVar34 = auVar103._12_2_;
                    sVar46 = auVar97._12_2_;
                    sVar47 = auVar97._14_2_;
                    uVar124 = (ushort)(sVar46 < sVar34) * sVar34 |
                              (ushort)(sVar46 >= sVar34) * sVar46;
                    sVar34 = auVar103._14_2_;
                    uVar125 = (ushort)(sVar47 < sVar34) * sVar34 |
                              (ushort)(sVar47 >= sVar34) * sVar47;
                    uVar116 = ((short)uVar127 < (short)uVar116) * uVar116 |
                              ((short)uVar127 >= (short)uVar116) * uVar127;
                    uVar119 = ((short)uVar131 < (short)uVar119) * uVar119 |
                              ((short)uVar131 >= (short)uVar119) * uVar131;
                    uVar120 = ((short)uVar134 < (short)uVar120) * uVar120 |
                              ((short)uVar134 >= (short)uVar120) * uVar134;
                    uVar121 = ((short)uVar137 < (short)uVar121) * uVar121 |
                              ((short)uVar137 >= (short)uVar121) * uVar137;
                    uVar122 = ((short)uVar140 < (short)uVar122) * uVar122 |
                              ((short)uVar140 >= (short)uVar122) * uVar140;
                    uVar123 = ((short)uVar143 < (short)uVar123) * uVar123 |
                              ((short)uVar143 >= (short)uVar123) * uVar143;
                    uVar124 = ((short)uVar146 < (short)uVar124) * uVar124 |
                              ((short)uVar146 >= (short)uVar124) * uVar146;
                    uVar125 = ((short)uVar149 < (short)uVar125) * uVar125 |
                              ((short)uVar149 >= (short)uVar125) * uVar149;
                  }
                  alVar93 = ptr[uVar37];
                  alVar80 = b_03[uVar37];
                  alVar64 = *palVar18;
                  alVar44 = b_05[uVar37];
                  iVar30 = 0;
                  while( true ) {
                    uVar90 = alVar93[0];
                    lVar95 = alVar93[1];
                    uVar74 = alVar80[0];
                    lVar86 = alVar80[1];
                    uVar58 = alVar64[0];
                    lVar31 = alVar64[1];
                    uVar53 = alVar44[0];
                    lVar19 = alVar44[1];
                    if (iVar12 <= iVar30) break;
                    alVar93[0] = uVar90 << 0x10;
                    alVar93[1] = lVar95 << 0x10 | uVar90 >> 0x30;
                    alVar80[0] = uVar74 << 0x10;
                    alVar80[1] = lVar86 << 0x10 | uVar74 >> 0x30;
                    alVar64[0] = uVar58 << 0x10;
                    alVar64[1] = lVar31 << 0x10 | uVar58 >> 0x30;
                    alVar44[0] = uVar53 << 0x10;
                    alVar44[1] = lVar19 << 0x10 | uVar53 >> 0x30;
                    iVar30 = iVar30 + 1;
                  }
                  *(int *)(*((ppVar15->field_4).trace)->trace_del_table + uVar17 * 4) =
                       (int)alVar93[1]._6_2_;
                  *(int *)(*(long *)((long)((ppVar15->field_4).trace)->trace_del_table + 8) +
                          uVar17 * 4) = (int)alVar80[1]._6_2_;
                  *(int *)(*(long *)((long)((ppVar15->field_4).trace)->trace_del_table + 0x10) +
                          uVar17 * 4) = (int)alVar64[1]._6_2_;
                  palVar20 = (__m128i *)(ulong)(uint)(int)alVar44[1]._6_2_;
                  *(int *)(*(long *)((long)((ppVar15->field_4).trace)->trace_del_table + 0x18) +
                          uVar17 * 4) = (int)alVar44[1]._6_2_;
                  uVar17 = uVar17 + 1;
                  local_1e8 = auVar76;
                  local_1c8 = auVar92;
                }
                for (uVar17 = 0; uVar32 != uVar17; uVar17 = uVar17 + 1) {
                  vH[0] = uVar17 & 0xffffffff;
                  vH[1] = uVar32;
                  arr_store_col(*(int **)((long)((ppVar15->field_4).trace)->trace_del_table + 0x20),
                                vH,(int32_t)palVar20,(int32_t)lVar28);
                  vH_00[0] = uVar17 & 0xffffffff;
                  vH_00[1] = uVar32;
                  arr_store_col(*(int **)((long)((ppVar15->field_4).trace)->trace_del_table + 0x28),
                                vH_00,(int32_t)palVar20,(int32_t)lVar28);
                  vH_01[0] = uVar17 & 0xffffffff;
                  vH_01[1] = uVar32;
                  arr_store_col(*(int **)((long)((ppVar15->field_4).trace)->trace_del_table + 0x30),
                                vH_01,(int32_t)palVar20,(int32_t)lVar28);
                  vH_02[0] = uVar17 & 0xffffffff;
                  vH_02[1] = uVar32;
                  arr_store_col(*(int **)((long)((ppVar15->field_4).trace)->trace_del_table + 0x38),
                                vH_02,(int32_t)palVar20,(int32_t)lVar28);
                }
                alVar81 = ptr[uVar37];
                alVar65 = b_03[uVar37];
                alVar56 = *palVar18;
                alVar45 = b_05[uVar37];
                iVar30 = 0;
                while( true ) {
                  uVar53 = alVar81[0];
                  lVar86 = alVar81[1];
                  uVar17 = alVar65[0];
                  lVar31 = alVar65[1];
                  uVar32 = alVar56[0];
                  lVar19 = alVar56[1];
                  uVar37 = alVar45[0];
                  lVar28 = alVar45[1];
                  if (iVar12 <= iVar30) break;
                  alVar81[0] = uVar53 << 0x10;
                  alVar81[1] = lVar86 << 0x10 | uVar53 >> 0x30;
                  alVar65[0] = uVar17 << 0x10;
                  alVar65[1] = lVar31 << 0x10 | uVar17 >> 0x30;
                  alVar56[0] = uVar32 << 0x10;
                  alVar56[1] = lVar19 << 0x10 | uVar32 >> 0x30;
                  alVar45[0] = uVar37 << 0x10;
                  alVar45[1] = lVar28 << 0x10 | uVar37 >> 0x30;
                  iVar30 = iVar30 + 1;
                }
                auVar94._0_2_ = -(ushort)((short)uVar128 < (short)local_128);
                auVar94._2_2_ = -(ushort)((short)uVar132 < (short)uStack_126);
                auVar94._4_2_ = -(ushort)((short)uVar135 < (short)local_128);
                auVar94._6_2_ = -(ushort)((short)uVar138 < (short)uStack_126);
                auVar94._8_2_ = -(ushort)((short)uVar141 < (short)local_128);
                auVar94._10_2_ = -(ushort)((short)uVar144 < (short)uStack_126);
                auVar94._12_2_ = -(ushort)((short)uVar147 < (short)local_128);
                auVar94._14_2_ = -(ushort)((short)uVar150 < (short)uStack_126);
                auVar118._0_2_ = -(ushort)((short)local_88 < (short)uVar116);
                auVar118._2_2_ = -(ushort)((short)uStack_86 < (short)uVar119);
                auVar118._4_2_ = -(ushort)((short)local_88 < (short)uVar120);
                auVar118._6_2_ = -(ushort)((short)uStack_86 < (short)uVar121);
                auVar118._8_2_ = -(ushort)((short)local_88 < (short)uVar122);
                auVar118._10_2_ = -(ushort)((short)uStack_86 < (short)uVar123);
                auVar118._12_2_ = -(ushort)((short)local_88 < (short)uVar124);
                auVar118._14_2_ = -(ushort)((short)uStack_86 < (short)uVar125);
                auVar118 = auVar118 | auVar94;
                if ((((((((((((((((auVar118 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                 && (auVar118 >> 0xf & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                                (auVar118 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar118 >> 0x1f & (undefined1  [16])0x1) ==
                                  (undefined1  [16])0x0) &&
                              (auVar118 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                             && (auVar118 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                            && (auVar118 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                           && (auVar118 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                          && (auVar118 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar118 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar118 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar118 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar118 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar118 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar118 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    -1 < auVar118[0xf]) {
                  sVar34 = alVar81[1]._6_2_;
                  sVar46 = alVar65[1]._6_2_;
                  sVar47 = alVar56[1]._6_2_;
                  sVar48 = alVar45[1]._6_2_;
                }
                else {
                  *(byte *)&ppVar15->flag = (byte)ppVar15->flag | 0x40;
                  sVar34 = 0;
                  sVar46 = 0;
                  sVar47 = 0;
                  sVar48 = 0;
                  iVar11 = 0;
                  uVar23 = 0;
                }
                ppVar15->score = (int)sVar34;
                ppVar15->end_query = uVar23;
                ppVar15->end_ref = iVar11;
                *(int *)(ppVar15->field_4).extra = (int)sVar46;
                ((ppVar15->field_4).stats)->similar = (int)sVar47;
                ((ppVar15->field_4).stats)->length = (int)sVar48;
                parasail_free(ptr_06);
                parasail_free(ptr_05);
                parasail_free(ptr_04);
                parasail_free(ptr_03);
                parasail_free(ptr_02);
                parasail_free(ptr_01);
                parasail_free(ptr_00);
                parasail_free(b_05);
                parasail_free(b_04);
                parasail_free(b_03);
                parasail_free(ptr);
                parasail_free(b_02);
                parasail_free(b_01);
                parasail_free(b_00);
                parasail_free(b);
                return ppVar15;
              }
            }
            return (parasail_result_t *)0x0;
          }
          __format = "%s: %s must be >= 0\n";
          pcVar21 = "gap";
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_nw_stats_rowcol_scan_profile_sse2_128_16",pcVar21);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvPm = NULL;
    __m128i* restrict pvPs = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvHM = NULL;
    __m128i* restrict pvHS = NULL;
    __m128i* restrict pvHL = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvHMMax = NULL;
    __m128i* restrict pvHSMax = NULL;
    __m128i* restrict pvHLMax = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i* restrict pvGapperL = NULL;
    int16_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    __m128i vZero;
    __m128i vOne;
    int16_t score = 0;
    int16_t matches = 0;
    int16_t similar = 0;
    int16_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    __m128i vSegLen;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP  = (__m128i*)profile->profile16.score;
    pvPm = (__m128i*)profile->profile16.matches;
    pvPs = (__m128i*)profile->profile16.similar;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi16(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInfFront = vZero;
    vSegLen = _mm_slli_si128(_mm_set1_epi16(segLen), 2);
    vNegInfFront = _mm_insert_epi16(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_adds_epi16(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi16(-segLen*gap), 2));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE  = parasail_memalign___m128i(16, segLen);
    pvEM = parasail_memalign___m128i(16, segLen);
    pvES = parasail_memalign___m128i(16, segLen);
    pvEL = parasail_memalign___m128i(16, segLen);
    pvH  = parasail_memalign___m128i(16, segLen);
    pvHM = parasail_memalign___m128i(16, segLen);
    pvHS = parasail_memalign___m128i(16, segLen);
    pvHL = parasail_memalign___m128i(16, segLen);
    pvHMax  = parasail_memalign___m128i(16, segLen);
    pvHMMax = parasail_memalign___m128i(16, segLen);
    pvHSMax = parasail_memalign___m128i(16, segLen);
    pvHLMax = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);
    pvGapperL = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int16_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvH) return NULL;
    if (!pvHM) return NULL;
    if (!pvHS) return NULL;
    if (!pvHL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;
    if (!pvGapper) return NULL;
    if (!pvGapperL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m128i(pvHM, vZero, segLen);
    parasail_memset___m128i(pvHS, vZero, segLen);
    parasail_memset___m128i(pvHL, vZero, segLen);
    parasail_memset___m128i(pvE, vNegLimit, segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vZero, segLen);
    {
        __m128i vGapper = _mm_subs_epi16(vZero,vGapO);
        __m128i vGapperL = vOne;
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            _mm_store_si128(pvGapperL+i, vGapperL);
            vGapper = _mm_subs_epi16(vGapper, vGapE);
            vGapperL = _mm_adds_epi16(vGapperL, vOne);
        }
    }

    /* initialize H */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_16_t h;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
            }
            _mm_store_si128(&pvH[index], h.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT16_MIN ? INT16_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vE_ext;
        __m128i vE_opn;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vHt;
        __m128i vHtM;
        __m128i vHtS;
        __m128i vHtL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vF_opn;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        __m128i vHp;
        __m128i vHpM;
        __m128i vHpS;
        __m128i vHpL;
        __m128i *pvW;
        __m128i vW;
        __m128i *pvWM;
        __m128i vWM;
        __m128i *pvWS;
        __m128i vWS;
        __m128i case1;
        __m128i case2;
        __m128i vGapper;
        __m128i vGapperL;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHpM = _mm_load_si128(pvHM+(segLen-1));
        vHpS = _mm_load_si128(pvHS+(segLen-1));
        vHpL = _mm_load_si128(pvHL+(segLen-1));
        vHp = _mm_slli_si128(vHp, 2);
        vHpM = _mm_slli_si128(vHpM, 2);
        vHpS = _mm_slli_si128(vHpS, 2);
        vHpL = _mm_slli_si128(vHpL, 2);
        vHp = _mm_insert_epi16(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWM= pvPm+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWS= pvPs+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm_subs_epi16(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vZero;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vHM= _mm_load_si128(pvHM+i);
            vHS= _mm_load_si128(pvHS+i);
            vHL= _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM= _mm_load_si128(pvEM+i);
            vES= _mm_load_si128(pvES+i);
            vEL= _mm_load_si128(pvEL+i);
            vW = _mm_load_si128(pvW+i);
            vWM = _mm_load_si128(pvWM+i);
            vWS = _mm_load_si128(pvWS+i);
            vGapper = _mm_load_si128(pvGapper+i);
            vGapperL = _mm_load_si128(pvGapperL+i);
            vE_opn = _mm_subs_epi16(vH, vGapO);
            vE_ext = _mm_subs_epi16(vE, vGapE);
            case1 = _mm_cmpgt_epi16(vE_opn, vE_ext);
            vE = _mm_max_epi16(vE_opn, vE_ext);
            vEM = _mm_blendv_epi8_rpl(vEM, vHM, case1);
            vES = _mm_blendv_epi8_rpl(vES, vHS, case1);
            vEL = _mm_blendv_epi8_rpl(vEL, vHL, case1);
            vEL = _mm_adds_epi16(vEL, vOne);
            vGapper = _mm_adds_epi16(vHt, vGapper);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi16(vF, vGapper),
                    _mm_cmpeq_epi16(vF, vGapper));
            vF = _mm_max_epi16(vF, vGapper);
            vFM = _mm_blendv_epi8_rpl(vHtM, vFM, case1);
            vFS = _mm_blendv_epi8_rpl(vHtS, vFS, case1);
            vFL = _mm_blendv_epi8_rpl(
                    _mm_adds_epi16(vHtL, vGapperL),
                    vFL, case1);
            vHp = _mm_adds_epi16(vHp, vW);
            vHpM = _mm_adds_epi16(vHpM, vWM);
            vHpS = _mm_adds_epi16(vHpS, vWS);
            vHpL = _mm_adds_epi16(vHpL, vOne);
            case1 = _mm_cmpgt_epi16(vE, vHp);
            vHt = _mm_max_epi16(vE, vHp);
            vHtM = _mm_blendv_epi8_rpl(vHpM, vEM, case1);
            vHtS = _mm_blendv_epi8_rpl(vHpS, vES, case1);
            vHtL = _mm_blendv_epi8_rpl(vHpL, vEL, case1);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvEM+i, vEM);
            _mm_store_si128(pvES+i, vES);
            _mm_store_si128(pvEL+i, vEL);
            _mm_store_si128(pvH+i, vHp);
            _mm_store_si128(pvHM+i, vHpM);
            _mm_store_si128(pvHS+i, vHpS);
            _mm_store_si128(pvHL+i, vHpL);
            vHp = vH;
            vHpM = vHM;
            vHpS = vHS;
            vHpL = vHL;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 2);
        vHtM = _mm_slli_si128(vHtM, 2);
        vHtS = _mm_slli_si128(vHtS, 2);
        vHtL = _mm_slli_si128(vHtL, 2);
        vHt = _mm_insert_epi16(vHt, boundary[j+1], 0);
        vGapper = _mm_load_si128(pvGapper);
        vGapperL = _mm_load_si128(pvGapperL);
        vGapper = _mm_adds_epi16(vHt, vGapper);
        case1 = _mm_or_si128(
                _mm_cmpgt_epi16(vGapper, vF),
                _mm_cmpeq_epi16(vGapper, vF));
        vF = _mm_max_epi16(vF, vGapper);
        vFM = _mm_blendv_epi8_rpl(vFM, vHtM, case1);
        vFS = _mm_blendv_epi8_rpl(vFS, vHtS, case1);
        vFL = _mm_blendv_epi8_rpl(
                vFL,
                _mm_adds_epi16(vHtL, vGapperL),
                case1);
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 2);
            __m128i vFtM = _mm_slli_si128(vFM, 2);
            __m128i vFtS = _mm_slli_si128(vFS, 2);
            __m128i vFtL = _mm_slli_si128(vFL, 2);
            vFt = _mm_adds_epi16(vFt, vSegLenXgap);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi16(vFt, vF),
                    _mm_cmpeq_epi16(vFt, vF));
            vF = _mm_max_epi16(vF, vFt);
            vFM = _mm_blendv_epi8_rpl(vFM, vFtM, case1);
            vFS = _mm_blendv_epi8_rpl(vFS, vFtS, case1);
            vFL = _mm_blendv_epi8_rpl(
                    vFL,
                    _mm_adds_epi16(vFtL, vSegLen),
                    case1);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 2);
        vFM = _mm_slli_si128(vFM, 2);
        vFS = _mm_slli_si128(vFS, 2);
        vFL = _mm_slli_si128(vFL, 2);
        vF = _mm_adds_epi16(vF, vNegInfFront);
        case1 = _mm_cmpgt_epi16(vF, vHt);
        vH = _mm_max_epi16(vF, vHt);
        vHM = _mm_blendv_epi8_rpl(vHtM, vFM, case1);
        vHS = _mm_blendv_epi8_rpl(vHtS, vFS, case1);
        vHL = _mm_blendv_epi8_rpl(vHtL, vFL, case1);
        for (i=0; i<segLen; ++i) {
            vHp = _mm_load_si128(pvH+i);
            vHpM = _mm_load_si128(pvHM+i);
            vHpS = _mm_load_si128(pvHS+i);
            vHpL = _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM = _mm_load_si128(pvEM+i);
            vES = _mm_load_si128(pvES+i);
            vEL = _mm_load_si128(pvEL+i);
            vF_opn = _mm_subs_epi16(vH, vGapO);
            vF_ext = _mm_subs_epi16(vF, vGapE);
            vF = _mm_max_epi16(vF_opn, vF_ext);
            case1 = _mm_cmpgt_epi16(vF_opn, vF_ext);
            vFM = _mm_blendv_epi8_rpl(vFM, vHM, case1);
            vFS = _mm_blendv_epi8_rpl(vFS, vHS, case1);
            vFL = _mm_blendv_epi8_rpl(vFL, vHL, case1);
            vFL = _mm_adds_epi16(vFL, vOne);
            vH = _mm_max_epi16(vHp, vE);
            vH = _mm_max_epi16(vH, vF);
            case1 = _mm_cmpeq_epi16(vH, vHp);
            case2 = _mm_cmpeq_epi16(vH, vF);
            vHM = _mm_blendv_epi8_rpl(
                    _mm_blendv_epi8_rpl(vEM, vFM, case2),
                    vHpM, case1);
            vHS = _mm_blendv_epi8_rpl(
                    _mm_blendv_epi8_rpl(vES, vFS, case2),
                    vHpS, case1);
            vHL = _mm_blendv_epi8_rpl(
                    _mm_blendv_epi8_rpl(vEL, vFL, case2),
                    vHpL, case1);
            _mm_store_si128(pvH+i, vH);
            _mm_store_si128(pvHM+i, vHM);
            _mm_store_si128(pvHS+i, vHS);
            _mm_store_si128(pvHL+i, vHL);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
#endif
        } 

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvH + offset);
            vHM = _mm_load_si128(pvHM + offset);
            vHS = _mm_load_si128(pvHS + offset);
            vHL = _mm_load_si128(pvHL + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
                vHM = _mm_slli_si128(vHM, 2);
                vHS = _mm_slli_si128(vHS, 2);
                vHL = _mm_slli_si128(vHL, 2);
            }
            result->stats->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7);
            result->stats->rowcols->matches_row[j] = (int16_t) _mm_extract_epi16 (vHM, 7);
            result->stats->rowcols->similar_row[j] = (int16_t) _mm_extract_epi16 (vHS, 7);
            result->stats->rowcols->length_row[j] = (int16_t) _mm_extract_epi16 (vHL, 7);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH+i);
        __m128i vHM = _mm_load_si128(pvHM+i);
        __m128i vHS = _mm_load_si128(pvHS+i);
        __m128i vHL = _mm_load_si128(pvHL+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvH + offset);
        __m128i vHM = _mm_load_si128(pvHM + offset);
        __m128i vHS = _mm_load_si128(pvHS + offset);
        __m128i vHL = _mm_load_si128(pvHL + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 2);
            vHM = _mm_slli_si128(vHM, 2);
            vHS = _mm_slli_si128(vHS, 2);
            vHL = _mm_slli_si128(vHL, 2);
        }
        score = (int16_t) _mm_extract_epi16 (vH, 7);
        matches = (int16_t) _mm_extract_epi16 (vHM, 7);
        similar = (int16_t) _mm_extract_epi16 (vHS, 7);
        length = (int16_t) _mm_extract_epi16 (vHL, 7);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvGapperL);
    parasail_free(pvGapper);
    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvHL);
    parasail_free(pvHS);
    parasail_free(pvHM);
    parasail_free(pvH);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);

    return result;
}